

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

void __thiscall
wasm::Module::removeElementSegments(Module *this,function<bool_(wasm::ElementSegment_*)> *pred)

{
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<bool_(wasm::ElementSegment_*)>::function
            ((function<bool_(wasm::ElementSegment_*)> *)&local_40,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>,std::unordered_map<wasm::Name,wasm::ElementSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::ElementSegment*>>>,wasm::ElementSegment>
            (&this->elementSegments,&this->elementSegmentsMap,
             (function<bool_(wasm::ElementSegment_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void Module::removeElementSegments(std::function<bool(ElementSegment*)> pred) {
  removeModuleElements(elementSegments, elementSegmentsMap, pred);
}